

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O3

void __thiscall merkle_tests::merkle_test::test_method(merkle_test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  _func_int ***ppp_Var3;
  undefined8 *puVar4;
  uchar *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer puVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint64_t uVar16;
  ulong __new_size;
  ulong uVar17;
  undefined8 *puVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  pointer psVar22;
  char *pcVar23;
  uint uVar24;
  uint uVar25;
  FastRandomContext *this_01;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  char *pcVar33;
  int iVar34;
  iterator in_R8;
  iterator pvVar35;
  iterator in_R9;
  iterator pvVar36;
  element_type *peVar37;
  uint256 *puVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  element_type *peVar43;
  uchar *puVar44;
  long in_FS_OFFSET;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  const_string file;
  Span<unsigned_char> output;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<unsigned_char> output_00;
  Span<unsigned_char> output_01;
  Span<unsigned_char> output_02;
  const_string file_05;
  const_string file_06;
  Span<unsigned_char> output_03;
  Span<unsigned_char> output_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  vector<uint256,_std::allocator<uint256>_> newBranch;
  bool newMutated;
  vector<uint256,_std::allocator<uint256>_> merkleTree;
  bool unmutatedMutated;
  uint256 newRoot;
  uint256 oldRoot;
  uint256 unmutatedRoot;
  vector<uint256,_std::allocator<uint256>_> oldBranch;
  uint256 h;
  CMutableTransaction mtx;
  uint256 result;
  undefined7 in_stack_fffffffffffff800;
  char cVar58;
  char cVar59;
  undefined8 uVar60;
  undefined4 local_7ec;
  uint local_7e0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 local_738 [16];
  uint256 *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  bool local_629;
  vector<uint256,_std::allocator<uint256>_> local_628;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  bool local_5d9;
  assertion_result local_5d8;
  uint256 local_5b8;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined1 local_588 [16];
  uint256 local_578;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [32];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  undefined1 auStack_4c0 [8];
  shared_count asStack_4b8 [2];
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  undefined1 auStack_490 [24];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  uint64_t local_448;
  undefined1 local_a8 [8];
  bool abStack_a0 [8];
  shared_count local_98;
  undefined1 *puStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng;
  __new_size = 0;
  do {
    uVar28 = (uint)__new_size;
    if (0x10 < uVar28) {
      do {
        uVar16 = RandomMixin<FastRandomContext>::randbits
                           (&this_01->super_RandomMixin<FastRandomContext>,0xc);
      } while (3999 < uVar16);
      __new_size = (ulong)((int)uVar16 + 0x11);
    }
    uVar12 = (uint)__new_size;
    uVar20 = uVar12 - 1;
    uVar32 = 0x10;
    if (uVar12 < 0x10) {
      uVar32 = uVar12;
    }
    if (uVar20 == 0) {
      uVar21 = 0x20;
    }
    else {
      uVar21 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar21 = uVar21 ^ 0x1f;
    }
    cVar58 = uVar12 != 0 && (__new_size & 1) == 0;
    iVar34 = 0;
    do {
      if (iVar34 == 0) {
        if (uVar12 == 0) break;
        uVar42 = 0;
        uVar39 = 0;
        uVar17 = __new_size;
        uVar41 = uVar12;
LAB_00433cd3:
        uVar40 = (uint)uVar17;
        uVar17 = 0;
      }
      else {
        bVar19 = 0;
        if (cVar58 != '\0') {
          bVar19 = 0;
          uVar17 = __new_size;
          do {
            bVar19 = bVar19 + 1;
            uVar39 = uVar17 & 2;
            uVar17 = uVar17 >> 1;
          } while (uVar39 == 0);
        }
        uVar40 = 1 << (bVar19 & 0x1f);
        uVar42 = (ulong)uVar40;
        if ((int)uVar12 <= (int)uVar40) break;
        uVar40 = uVar40 + uVar12;
        uVar17 = (ulong)uVar40;
        if (iVar34 == 1) {
          if (0 < (int)uVar40) {
            uVar39 = 0;
            uVar41 = uVar40;
            goto LAB_00433cd3;
          }
          break;
        }
        bVar19 = 0;
        if ((uVar40 & 1) == 0 && uVar40 != 0) {
          bVar19 = 0;
          uVar39 = uVar17;
          do {
            bVar19 = bVar19 + 1;
            uVar26 = uVar39 & 2;
            uVar39 = uVar39 >> 1;
          } while (uVar26 == 0);
        }
        uVar41 = 1 << (bVar19 & 0x1f);
        uVar39 = (ulong)uVar41;
        if ((int)uVar40 <= (int)uVar41) break;
        uVar41 = uVar41 + uVar40;
        if (iVar34 != 3) goto LAB_00433cd3;
        bVar19 = 0;
        if ((uVar41 & 1) == 0 && uVar41 != 0) {
          bVar19 = 0;
          uVar24 = uVar41;
          do {
            bVar19 = bVar19 + 1;
            uVar27 = uVar24 & 2;
            uVar24 = uVar24 >> 1;
          } while (uVar27 == 0);
        }
        uVar17 = (ulong)(uint)(1 << (bVar19 & 0x1f));
      }
      if ((int)uVar41 <= (int)uVar17) break;
      local_508._16_11_ = SUB1611((undefined1  [16])0x0,5);
      local_508._0_8_ = (pointer)0x0;
      local_508._8_3_ = 0;
      local_508._11_5_ = 0;
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
      local_538 = (undefined1  [16])0x0;
      local_548 = (undefined1  [16])0x0;
      local_558 = (undefined1  [16])0x0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)local_508,__new_size);
      if (uVar12 != 0) {
        lVar29 = 8;
        uVar26 = 0;
        do {
          CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_4a8);
          local_478._4_4_ = (uint32_t)uVar26;
          local_a8[0] = (class_property<bool>)0x0;
          local_a8._1_7_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_a0,
                     (CTransaction **)local_a8,(allocator<CTransaction> *)local_4c8,
                     (CMutableTransaction *)local_4a8);
          uVar60 = CONCAT71(local_a8._1_7_,local_a8[0]);
          uVar7 = CONCAT71(abStack_a0._1_7_,abStack_a0[0]);
          local_a8[0] = (class_property<bool>)0x0;
          local_a8._1_7_ = 0;
          abStack_a0[0] = false;
          abStack_a0[1] = false;
          abStack_a0[2] = false;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                             local_508._0_8_)->_M_ptr + lVar29);
          puVar4 = (undefined8 *)(local_508._0_8_ + lVar29 + -8);
          *puVar4 = uVar60;
          puVar4[1] = uVar7;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT71(abStack_a0._1_7_,abStack_a0[0]) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71(abStack_a0._1_7_,abStack_a0[0]));
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_498 + 8));
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_4a8);
          uVar26 = uVar26 + 1;
          lVar29 = lVar29 + 0x10;
        } while (__new_size != uVar26);
      }
      local_5d9 = false;
      BlockMerkleRoot(&local_578,(CBlock *)local_558,&local_5d9);
      local_5f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_5e8 = "";
      local_600 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0xd2;
      file.m_begin = (iterator)&local_5f0;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_600,msg)
      ;
      local_a8[0] = (class_property<bool>)(local_5d9 ^ 1);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xea8a28;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_610 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_608 = "";
      pvVar35 = (iterator)0x1;
      pvVar36 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_610,0xd2);
      iVar13 = (int)uVar17;
      boost::detail::shared_count::~shared_count(&local_98);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)local_508,(long)(int)(iVar13 + uVar41));
      uVar26 = uVar42;
      uVar30 = __new_size << 4 | 8;
      if (0 < (int)uVar42) {
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar30);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar30 - 8)) =
               p_Var1[uVar42 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var1,p_Var1 + uVar42 * -2);
          uVar26 = uVar26 - 1;
          uVar30 = uVar30 + 0x10;
        } while (uVar26 != 0);
      }
      if (0 < (int)uVar39) {
        uVar26 = (long)(int)uVar40 << 4 | 8;
        uVar42 = uVar39;
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar26);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar26 - 8)) =
               p_Var1[uVar39 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var1,p_Var1 + uVar39 * -2);
          uVar26 = uVar26 + 0x10;
          uVar42 = uVar42 - 1;
        } while (uVar42 != 0);
      }
      if (0 < (int)uVar17) {
        uVar26 = uVar17 & 0xffffffff;
        uVar42 = (long)(int)uVar41 << 4 | 8;
        uVar39 = uVar26;
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar42);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar42 - 8)) =
               p_Var1[uVar26 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var1,p_Var1 + uVar26 * -2);
          uVar42 = uVar42 + 0x10;
          uVar39 = uVar39 - 1;
        } while (uVar39 != 0);
      }
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint256 *)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::reserve
                (&local_628,
                 (CONCAT53(local_508._11_5_,local_508._8_3_) - local_508._0_8_ >> 3) + 0x10);
      psVar22 = (pointer)local_508._0_8_;
      if ((pointer)local_508._0_8_ != (pointer)CONCAT53(local_508._11_5_,local_508._8_3_)) {
        do {
          peVar6 = (psVar22->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                      ((vector<uint256,std::allocator<uint256>> *)&local_628,
                       (iterator)
                       local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish,&(peVar6->hash).m_wrapped);
          }
          else {
            uVar60 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar7 = *(undefined8 *)
                     ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar8 = *(undefined8 *)
                     ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
                 *(undefined8 *)
                  ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
                 uVar8;
            *(undefined8 *)
             ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar60;
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) =
                 uVar7;
            local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          psVar22 = psVar22 + 1;
        } while (psVar22 != (pointer)CONCAT53(local_508._11_5_,local_508._8_3_));
      }
      uVar39 = (ulong)((long)psVar22 - local_508._0_8_) >> 4;
      uVar42 = 0;
      local_7ec = 0;
      if (1 < (int)uVar39) {
        local_7ec = 0;
        do {
          uVar41 = (uint)uVar39;
          iVar13 = uVar41 - 1;
          lVar31 = uVar42 << 5;
          lVar29 = 0;
          uVar17 = CONCAT44((int)(uVar17 >> 0x20),(int)uVar42);
          do {
            iVar14 = (int)lVar29 + 1;
            if (iVar13 < iVar14) {
              iVar14 = iVar13;
            }
            puVar11 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar15 = iVar14 + (int)uVar42;
            if (lVar29 < iVar13 && iVar14 + 1U == uVar41) {
              puVar44 = ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                        + lVar31;
              puVar5 = ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                       lVar31 + 0x10;
              puVar2 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar15;
              auVar55[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] == *puVar44);
              auVar55[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] == puVar44[1]);
              auVar55[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] == puVar44[2]);
              auVar55[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] == puVar44[3]);
              auVar55[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] == puVar44[4]);
              auVar55[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] == puVar44[5]);
              auVar55[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] == puVar44[6]);
              auVar55[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] == puVar44[7]);
              auVar55[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] == puVar44[8]);
              auVar55[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] == puVar44[9]);
              auVar55[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] == puVar44[10]);
              auVar55[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] == puVar44[0xb])
              ;
              auVar55[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] == puVar44[0xc])
              ;
              auVar55[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] == puVar44[0xd])
              ;
              auVar55[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] == puVar44[0xe])
              ;
              auVar55[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] == puVar44[0xf])
              ;
              puVar44 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar15].super_base_blob<256U>.m_data.
                        _M_elems + 0x10;
              auVar46[0] = -(*puVar44 == *puVar5);
              auVar46[1] = -(puVar44[1] == puVar5[1]);
              auVar46[2] = -(puVar44[2] == puVar5[2]);
              auVar46[3] = -(puVar44[3] == puVar5[3]);
              auVar46[4] = -(puVar44[4] == puVar5[4]);
              auVar46[5] = -(puVar44[5] == puVar5[5]);
              auVar46[6] = -(puVar44[6] == puVar5[6]);
              auVar46[7] = -(puVar44[7] == puVar5[7]);
              auVar46[8] = -(puVar44[8] == puVar5[8]);
              auVar46[9] = -(puVar44[9] == puVar5[9]);
              auVar46[10] = -(puVar44[10] == puVar5[10]);
              auVar46[0xb] = -(puVar44[0xb] == puVar5[0xb]);
              auVar46[0xc] = -(puVar44[0xc] == puVar5[0xc]);
              auVar46[0xd] = -(puVar44[0xd] == puVar5[0xd]);
              auVar46[0xe] = -(puVar44[0xe] == puVar5[0xe]);
              auVar46[0xf] = -(puVar44[0xf] == puVar5[0xf]);
              auVar46 = auVar46 & auVar55;
              if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff) {
                local_7ec = 1;
              }
            }
            local_98.pi_ = (sp_counted_base *)0x0;
            puStack_90 = (undefined1 *)0x0;
            local_a8[0] = (class_property<bool>)0x0;
            local_a8._1_7_ = 0;
            abStack_a0[0] = false;
            abStack_a0[1] = false;
            abStack_a0[2] = false;
            abStack_a0[3] = false;
            abStack_a0[4] = false;
            abStack_a0[5] = false;
            abStack_a0[6] = false;
            abStack_a0[7] = false;
            local_458 = (undefined1  [16])0x0;
            local_468 = (undefined1  [16])0x0;
            local_478 = (undefined1  [16])0x0;
            auStack_490._8_16_ = (undefined1  [16])0x0;
            _local_498 = (undefined1  [16])0x0;
            local_4a8._0_8_ = (_func_int **)0x0;
            local_4a8[8] = false;
            local_4a8._9_7_ = 0;
            local_448 = 0;
            CSHA256::CSHA256((CSHA256 *)local_4a8);
            CSHA256::Write((CSHA256 *)local_4a8,
                           (puVar11->super_base_blob<256U>).m_data._M_elems + lVar31,0x20);
            CSHA256::Write((CSHA256 *)local_4a8,(uchar *)(puVar11 + iVar15),0x20);
            output.m_size = 0x20;
            output.m_data = local_a8;
            CHash256::Finalize((CHash256 *)local_4a8,output);
            if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                        (&local_628,
                         (iterator)
                         local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint256 *)local_a8);
            }
            else {
              *(sp_counted_base **)
               (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10)
                   = local_98.pi_;
              *(undefined1 **)
               (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18)
                   = puStack_90;
              *(ulong *)((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems
                   = CONCAT71(local_a8._1_7_,local_a8[0]);
              *(ulong *)(((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data.
                         _M_elems + 8) = CONCAT71(abStack_a0._1_7_,abStack_a0[0]);
              local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            lVar29 = lVar29 + 2;
            lVar31 = lVar31 + 0x40;
            uVar42 = uVar17 & 0xffffffff;
          } while ((int)lVar29 < (int)uVar41);
          uVar42 = (ulong)((int)uVar17 + uVar41);
          uVar39 = (ulong)(uVar41 + 1 >> 1);
        } while (2 < uVar41);
      }
      uVar60 = CONCAT44((int)(uVar17 >> 0x20),local_7ec);
      if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_598 = 0;
        uStack_590 = 0;
        local_588 = (undefined1  [16])0x0;
      }
      else {
        local_598 = *(undefined8 *)
                     local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems;
        uStack_590 = *(undefined8 *)
                      (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems +
                      8);
        local_588 = *(undefined1 (*) [16])
                     (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems +
                     0x10);
      }
      local_629 = false;
      BlockMerkleRoot(&local_5b8,(CBlock *)local_558,&local_629);
      local_640 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_638 = "";
      local_650 = &boost::unit_test::basic_cstring<char_const>::null;
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xe5;
      file_00.m_begin = (iterator)&local_640;
      msg_00.m_end = pvVar36;
      msg_00.m_begin = pvVar35;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_650,
                 msg_00);
      auVar51[0] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x10] == local_588[0]);
      auVar51[1] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x11] == local_588[1]);
      auVar51[2] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x12] == local_588[2]);
      auVar51[3] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x13] == local_588[3]);
      auVar51[4] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x14] == local_588[4]);
      auVar51[5] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x15] == local_588[5]);
      auVar51[6] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x16] == local_588[6]);
      auVar51[7] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x17] == local_588[7]);
      auVar51[8] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x18] == local_588[8]);
      auVar51[9] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x19] == local_588[9]);
      auVar51[10] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a] == local_588[10]);
      auVar51[0xb] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b] == local_588[0xb]);
      auVar51[0xc] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c] == local_588[0xc]);
      auVar51[0xd] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d] == local_588[0xd]);
      auVar51[0xe] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e] == local_588[0xe]);
      auVar51[0xf] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f] == local_588[0xf]);
      auVar47[0] = -((class_property<bool>)local_5b8.super_base_blob<256U>.m_data._M_elems[0] ==
                    local_598._0_1_);
      auVar47[1] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[1] == local_598._1_1_);
      auVar47[2] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[2] == local_598._2_1_);
      auVar47[3] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[3] == local_598._3_1_);
      auVar47[4] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[4] == local_598._4_1_);
      auVar47[5] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[5] == local_598._5_1_);
      auVar47[6] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[6] == local_598._6_1_);
      auVar47[7] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[7] == local_598._7_1_);
      auVar47[8] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[8] == (uchar)uStack_590);
      auVar47[9] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[9] == uStack_590._1_1_);
      auVar47[10] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[10] == uStack_590._2_1_);
      auVar47[0xb] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xb] == uStack_590._3_1_);
      auVar47[0xc] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xc] == uStack_590._4_1_);
      auVar47[0xd] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xd] == uStack_590._5_1_);
      auVar47[0xe] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xe] == uStack_590._6_1_);
      auVar47[0xf] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xf] == uStack_590._7_1_);
      auVar47 = auVar47 & auVar51;
      local_a8[0] = (class_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar47[0xf] >> 7) << 0xf) == 0xffff);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xea8a42;
      auStack_4c0 = (undefined1  [8])0xea8a54;
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_660 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_658 = "";
      pvVar35 = (iterator)0x1;
      pvVar36 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_660,0xe5,uVar60);
      cVar59 = (char)uVar60;
      boost::detail::shared_count::~shared_count(&local_98);
      local_670 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_668 = "";
      local_680 = &boost::unit_test::basic_cstring<char_const>::null;
      local_678 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xe6;
      file_01.m_begin = (iterator)&local_670;
      msg_01.m_end = pvVar36;
      msg_01.m_begin = pvVar35;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_680,
                 msg_01);
      auVar56[0] = -(local_578.super_base_blob<256U>.m_data._M_elems[0] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0]);
      auVar56[1] = -(local_578.super_base_blob<256U>.m_data._M_elems[1] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[1]);
      auVar56[2] = -(local_578.super_base_blob<256U>.m_data._M_elems[2] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[2]);
      auVar56[3] = -(local_578.super_base_blob<256U>.m_data._M_elems[3] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[3]);
      auVar56[4] = -(local_578.super_base_blob<256U>.m_data._M_elems[4] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[4]);
      auVar56[5] = -(local_578.super_base_blob<256U>.m_data._M_elems[5] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[5]);
      auVar56[6] = -(local_578.super_base_blob<256U>.m_data._M_elems[6] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[6]);
      auVar56[7] = -(local_578.super_base_blob<256U>.m_data._M_elems[7] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[7]);
      auVar56[8] = -(local_578.super_base_blob<256U>.m_data._M_elems[8] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[8]);
      auVar56[9] = -(local_578.super_base_blob<256U>.m_data._M_elems[9] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[9]);
      auVar56[10] = -(local_578.super_base_blob<256U>.m_data._M_elems[10] ==
                     local_5b8.super_base_blob<256U>.m_data._M_elems[10]);
      auVar56[0xb] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar56[0xc] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar56[0xd] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar56[0xe] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar56[0xf] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar48[0] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar48[1] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar48[2] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar48[3] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar48[4] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar48[5] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar48[6] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar48[7] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar48[8] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar48[9] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar48[10] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar48[0xb] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar48[0xc] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar48[0xd] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar48[0xe] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar48[0xf] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar48 = auVar48 & auVar56;
      local_a8[0] = (class_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) == 0xffff);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xea8a55;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_690 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_688 = "";
      pvVar35 = (iterator)0x1;
      pvVar36 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_690,0xe6);
      boost::detail::shared_count::~shared_count(&local_98);
      local_6a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_698 = "";
      local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xe7;
      file_02.m_begin = (iterator)&local_6a0;
      msg_02.m_end = pvVar36;
      msg_02.m_begin = pvVar35;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6b0,
                 msg_02);
      _local_498 = (undefined1  [16])0x0;
      local_4a8._0_8_ = (_func_int **)0x0;
      local_4a8[8] = false;
      local_4a8._9_7_ = 0;
      auVar9[1] = local_5b8.super_base_blob<256U>.m_data._M_elems[1];
      auVar9[0] = local_5b8.super_base_blob<256U>.m_data._M_elems[0];
      auVar9[2] = local_5b8.super_base_blob<256U>.m_data._M_elems[2];
      auVar9[3] = local_5b8.super_base_blob<256U>.m_data._M_elems[3];
      auVar9[4] = local_5b8.super_base_blob<256U>.m_data._M_elems[4];
      auVar9[5] = local_5b8.super_base_blob<256U>.m_data._M_elems[5];
      auVar9[6] = local_5b8.super_base_blob<256U>.m_data._M_elems[6];
      auVar9[7] = local_5b8.super_base_blob<256U>.m_data._M_elems[7];
      auVar9[8] = local_5b8.super_base_blob<256U>.m_data._M_elems[8];
      auVar9[9] = local_5b8.super_base_blob<256U>.m_data._M_elems[9];
      auVar9[10] = local_5b8.super_base_blob<256U>.m_data._M_elems[10];
      auVar9[0xb] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar9[0xc] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar9[0xd] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar9[0xe] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar9[0xf] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xf];
      auVar52[1] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x11];
      auVar52[0] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x10];
      auVar52[2] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x12];
      auVar52[3] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x13];
      auVar52[4] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x14];
      auVar52[5] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x15];
      auVar52[6] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x16];
      auVar52[7] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x17];
      auVar52[8] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x18];
      auVar52[9] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x19];
      auVar52[10] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a];
      auVar52[0xb] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b];
      auVar52[0xc] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c];
      auVar52[0xd] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d];
      auVar52[0xe] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e];
      auVar52[0xf] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f];
      auVar52 = auVar52 | auVar9;
      auVar53[0] = -(auVar52[0] == '\0');
      auVar53[1] = -(auVar52[1] == '\0');
      auVar53[2] = -(auVar52[2] == '\0');
      auVar53[3] = -(auVar52[3] == '\0');
      auVar53[4] = -(auVar52[4] == '\0');
      auVar53[5] = -(auVar52[5] == '\0');
      auVar53[6] = -(auVar52[6] == '\0');
      auVar53[7] = -(auVar52[7] == '\0');
      auVar53[8] = -(auVar52[8] == '\0');
      auVar53[9] = -(auVar52[9] == '\0');
      auVar53[10] = -(auVar52[10] == '\0');
      auVar53[0xb] = -(auVar52[0xb] == '\0');
      auVar53[0xc] = -(auVar52[0xc] == '\0');
      auVar53[0xd] = -(auVar52[0xd] == '\0');
      auVar53[0xe] = -(auVar52[0xe] == '\0');
      auVar53[0xf] = -(auVar52[0xf] == '\0');
      local_4c8[0] = (readonly_property<bool>)
                     (readonly_property<bool>)
                     (((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar53[0xf] >> 7) << 0xf) == 0xffff) != (uVar12 != 0));
      _auStack_4c0 = (undefined1  [16])0x0;
      local_4e8._8_8_ = "";
      local_4e8._0_8_ = "(newRoot == uint256()) == (ntx == 0)";
      abStack_a0[0] = false;
      local_a8[0] = (class_property<bool>)0xc8;
      local_a8._1_7_ = 0x13ae1;
      local_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      puStack_90 = local_4e8;
      local_6c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6b8 = "";
      pvVar35 = (iterator)0x1;
      pvVar36 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_4c8,(lazy_ostream *)local_a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_6c0,0xe7);
      boost::detail::shared_count::~shared_count((shared_count *)(auStack_4c0 + 8));
      local_6d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6c8 = "";
      local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xe8;
      file_03.m_begin = (iterator)&local_6d0;
      msg_03.m_end = pvVar36;
      msg_03.m_begin = pvVar35;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6e0,
                 msg_03);
      local_a8[0] = (class_property<bool>)((bool)cVar59 == local_629);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xea8a93;
      auStack_4c0 = (undefined1  [8])0xea8aab;
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_6f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6e8 = "";
      pvVar35 = (iterator)0x1;
      pvVar36 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_6f0,0xe8);
      boost::detail::shared_count::~shared_count(&local_98);
      local_700 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6f8 = "";
      local_710 = &boost::unit_test::basic_cstring<char_const>::null;
      local_708 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xe9;
      file_04.m_begin = (iterator)&local_700;
      msg_04.m_end = pvVar36;
      msg_04.m_begin = pvVar35;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_710,
                 msg_04);
      local_a8[0] = (class_property<bool>)(local_629 == (iVar34 != 0));
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xea8aac;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_720 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_718 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                 CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_720,0xe9);
      boost::detail::shared_count::~shared_count(&local_98);
      if ((iVar34 == 0) && (uVar12 != 0)) {
        uVar17 = 0;
        do {
          iVar13 = (int)uVar17;
          if (0x10 < uVar12) {
            do {
              uVar17 = RandomMixin<FastRandomContext>::randbits
                                 (&this_01->super_RandomMixin<FastRandomContext>,0x20 - uVar21);
            } while (uVar20 < uVar17);
          }
          local_5d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_5d8._1_7_ = 0;
          local_5d8.m_message.px = (element_type *)0x0;
          local_5d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::vector<uint256,_std::allocator<uint256>_>::resize
                    ((vector<uint256,_std::allocator<uint256>_> *)&local_5d8,
                     CONCAT53(local_508._11_5_,local_508._8_3_) - local_508._0_8_ >> 4);
          peVar43 = local_5d8.m_message.px;
          peVar37 = (element_type *)
                    CONCAT71(local_5d8._1_7_,
                             local_5d8.p_predicate_value.super_readonly_property<bool>.
                             super_class_property<bool>.value);
          if ((pointer)CONCAT53(local_508._11_5_,local_508._8_3_) != (pointer)local_508._0_8_) {
            lVar29 = 0;
            uVar39 = 0;
            do {
              lVar31 = *(long *)((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)local_508._0_8_)->_M_ptr + lVar29);
              uVar60 = *(undefined8 *)(lVar31 + 0x39);
              uVar7 = *(undefined8 *)(lVar31 + 0x41);
              uVar8 = *(undefined8 *)(lVar31 + 0x51);
              puVar4 = (undefined8 *)
                       (&(peVar37->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x10 + lVar29 * 2);
              *puVar4 = *(undefined8 *)(lVar31 + 0x49);
              puVar4[1] = uVar8;
              puVar4 = (undefined8 *)
                       ((long)&(peVar37->m_stream).
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream + lVar29 * 2);
              *puVar4 = uVar60;
              puVar4[1] = uVar7;
              uVar39 = uVar39 + 1;
              lVar29 = lVar29 + 0x10;
            } while (uVar39 < (ulong)(CONCAT53(local_508._11_5_,local_508._8_3_) - local_508._0_8_
                                     >> 4));
          }
          local_738 = (undefined1  [16])0x0;
          local_728 = (uint256 *)0x0;
          local_7e0 = (uint)uVar17;
          if (local_5d8.m_message.px != peVar37) {
            uVar39 = 0;
            memset(local_4a8,0,0x400);
            uVar42 = 0xffffffff;
            uVar41 = 0;
            do {
              uVar24 = (uint)uVar42;
              puVar38 = (uint256 *)local_4a8;
              ppp_Var3 = &(peVar37->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream + uVar39 * 4;
              local_4c8 = (undefined1  [8])*ppp_Var3;
              auStack_4c0 = (undefined1  [8])ppp_Var3[1];
              puVar4 = (undefined8 *)
                       (&(peVar37->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x10 + uVar39 * 0x20);
              asStack_4b8[0].pi_ = (sp_counted_base *)*puVar4;
              asStack_4b8[1].pi_ = (sp_counted_base *)puVar4[1];
              bVar45 = uVar41 == local_7e0;
              uVar40 = uVar41 + 1;
              uVar39 = (ulong)uVar40;
              uVar26 = 0;
              if ((uVar41 & 1) != 0) {
                bVar45 = uVar41 == local_7e0;
                uVar26 = 0;
                uVar30 = uVar42;
                do {
                  if (bVar45) {
                    if ((uint256 *)local_738._8_8_ == local_728) {
                      std::vector<uint256,std::allocator<uint256>>::
                      _M_realloc_insert<uint256_const&>
                                ((vector<uint256,std::allocator<uint256>> *)local_738,
                                 (iterator)local_738._8_8_,puVar38);
                    }
                    else {
                      uVar60 = *(undefined8 *)(puVar38->super_base_blob<256U>).m_data._M_elems;
                      uVar7 = *(undefined8 *)((puVar38->super_base_blob<256U>).m_data._M_elems + 8);
                      uVar8 = *(undefined8 *)
                               ((puVar38->super_base_blob<256U>).m_data._M_elems + 0x18);
                      *(undefined8 *)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                           *(undefined8 *)((puVar38->super_base_blob<256U>).m_data._M_elems + 0x10);
                      *(undefined8 *)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) = uVar8;
                      *(undefined8 *)(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                           uVar60;
                      *(undefined8 *)((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) =
                           uVar7;
LAB_00434ae6:
                      local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                    }
                  }
                  else if (uVar42 == uVar26) {
                    if ((uint256 *)local_738._8_8_ != local_728) {
                      *(sp_counted_base **)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                           asStack_4b8[0].pi_;
                      *(sp_counted_base **)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                           asStack_4b8[1].pi_;
                      *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                           local_4c8;
                      *(undefined1 (*) [8])
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0;
                      bVar45 = true;
                      goto LAB_00434ae6;
                    }
                    bVar45 = true;
                    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                              ((vector<uint256,std::allocator<uint256>> *)local_738,
                               (iterator)local_738._8_8_,(uint256 *)local_4c8);
                  }
                  local_4d8 = (undefined1  [16])0x0;
                  local_4e8 = (undefined1  [16])0x0;
                  local_58 = (undefined1  [16])0x0;
                  local_68 = (undefined1  [16])0x0;
                  local_78 = (undefined1  [16])0x0;
                  local_88 = (undefined1  [16])0x0;
                  local_98.pi_ = (sp_counted_base *)0x0;
                  puStack_90 = (undefined1 *)0x0;
                  local_a8[0] = (class_property<bool>)0x0;
                  local_a8._1_7_ = 0;
                  abStack_a0[0] = false;
                  abStack_a0[1] = false;
                  abStack_a0[2] = false;
                  abStack_a0[3] = false;
                  abStack_a0[4] = false;
                  abStack_a0[5] = false;
                  abStack_a0[6] = false;
                  abStack_a0[7] = false;
                  local_48 = 0;
                  CSHA256::CSHA256((CSHA256 *)local_a8);
                  CSHA256::Write((CSHA256 *)local_a8,(uchar *)puVar38,0x20);
                  CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                  output_00.m_size = 0x20;
                  output_00.m_data = local_4e8;
                  CHash256::Finalize((CHash256 *)local_a8,output_00);
                  uVar24 = (uint)uVar30;
                  local_4c8 = (undefined1  [8])local_4e8._0_8_;
                  auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                  asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                  asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                  bVar19 = (byte)uVar26;
                  uVar26 = uVar26 + 1;
                  puVar38 = puVar38 + 1;
                } while ((uVar40 >> (bVar19 & 0x1f) & 2) == 0);
                peVar37 = (element_type *)
                          CONCAT71(local_5d8._1_7_,
                                   local_5d8.p_predicate_value.super_readonly_property<bool>.
                                   super_class_property<bool>.value);
                peVar43 = local_5d8.m_message.px;
              }
              lVar29 = (uVar26 & 0xffffffff) * 0x20;
              *(sp_counted_base **)(local_498 + lVar29) = asStack_4b8[0].pi_;
              *(sp_counted_base **)(local_498 + lVar29 + 8) = asStack_4b8[1].pi_;
              *(undefined1 (*) [8])(local_4a8 + lVar29) = local_4c8;
              *(undefined1 (*) [8])(local_4a8 + lVar29 + 8) = auStack_4c0;
              if (bVar45) {
                uVar24 = (uint)uVar26;
              }
              uVar42 = (ulong)uVar24;
              uVar41 = uVar40;
            } while (uVar39 < (ulong)((long)peVar43 - (long)peVar37 >> 5));
            uVar41 = 0xffffffff;
            puVar4 = (undefined8 *)local_4c8;
            do {
              puVar18 = puVar4;
              uVar41 = uVar41 + 1;
              uVar27 = 1 << ((byte)uVar41 & 0x1f);
              puVar4 = puVar18 + 4;
            } while ((uVar40 >> (uVar41 & 0x1f) & 1) == 0);
            local_4c8 = (undefined1  [8])puVar18[4];
            _auStack_4c0 = *(undefined1 (*) [16])(puVar18 + 5);
            asStack_4b8[1].pi_ = (sp_counted_base *)puVar18[7];
            if (uVar40 != uVar27) {
              bVar45 = uVar24 == uVar41;
              do {
                if (bVar45) {
                  if ((uint256 *)local_738._8_8_ == local_728) {
                    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                              ((vector<uint256,std::allocator<uint256>> *)local_738,
                               (iterator)local_738._8_8_,(uint256 *)local_4c8);
                  }
                  else {
                    *(sp_counted_base **)
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                         asStack_4b8[0].pi_;
                    *(sp_counted_base **)
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                         asStack_4b8[1].pi_;
                    *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                         local_4c8;
                    *(undefined1 (*) [8])
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0;
                    local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                  }
                }
                local_4d8 = (undefined1  [16])0x0;
                local_4e8 = (undefined1  [16])0x0;
                local_58 = (undefined1  [16])0x0;
                local_68 = (undefined1  [16])0x0;
                local_78 = (undefined1  [16])0x0;
                local_88 = (undefined1  [16])0x0;
                local_98.pi_ = (sp_counted_base *)0x0;
                puStack_90 = (undefined1 *)0x0;
                local_a8[0] = (class_property<bool>)0x0;
                local_a8._1_7_ = 0;
                abStack_a0[0] = false;
                abStack_a0[1] = false;
                abStack_a0[2] = false;
                abStack_a0[3] = false;
                abStack_a0[4] = false;
                abStack_a0[5] = false;
                abStack_a0[6] = false;
                abStack_a0[7] = false;
                local_48 = 0;
                CSHA256::CSHA256((CSHA256 *)local_a8);
                CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                output_01.m_size = 0x20;
                output_01.m_data = local_4e8;
                CHash256::Finalize((CHash256 *)local_a8,output_01);
                local_4c8 = (undefined1  [8])local_4e8._0_8_;
                asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                uVar25 = (int)uVar39 + uVar27;
                uVar39 = (ulong)uVar25;
                uVar40 = uVar41 + 1;
                bVar19 = (byte)uVar40;
                if ((uVar25 >> (uVar40 & 0x1f) & 1) == 0) {
                  lVar29 = (long)(int)uVar40 - (long)(int)uVar24;
                  puVar38 = (uint256 *)(local_4a8 + (long)(int)uVar40 * 0x20);
                  uVar41 = uVar41 + 2;
                  lVar31 = 0;
                  do {
                    if (bVar45) {
                      if ((uint256 *)local_738._8_8_ == local_728) {
                        std::vector<uint256,std::allocator<uint256>>::
                        _M_realloc_insert<uint256_const&>
                                  ((vector<uint256,std::allocator<uint256>> *)local_738,
                                   (iterator)local_738._8_8_,puVar38);
                      }
                      else {
                        uVar60 = *(undefined8 *)(puVar38->super_base_blob<256U>).m_data._M_elems;
                        uVar7 = *(undefined8 *)
                                 ((puVar38->super_base_blob<256U>).m_data._M_elems + 8);
                        uVar8 = *(undefined8 *)
                                 ((puVar38->super_base_blob<256U>).m_data._M_elems + 0x18);
                        *(undefined8 *)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                             *(undefined8 *)
                              ((puVar38->super_base_blob<256U>).m_data._M_elems + 0x10);
                        *(undefined8 *)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) = uVar8;
                        *(undefined8 *)(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                             uVar60;
                        *(undefined8 *)((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8)
                             = uVar7;
LAB_00434ea9:
                        local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                      }
                    }
                    else if (lVar29 == lVar31) {
                      if ((uint256 *)local_738._8_8_ != local_728) {
                        *(sp_counted_base **)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                             asStack_4b8[0].pi_;
                        *(sp_counted_base **)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                             asStack_4b8[1].pi_;
                        *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems
                             = local_4c8;
                        *(undefined1 (*) [8])
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0
                        ;
                        bVar45 = true;
                        goto LAB_00434ea9;
                      }
                      bVar45 = true;
                      std::vector<uint256,std::allocator<uint256>>::
                      _M_realloc_insert<uint256_const&>
                                ((vector<uint256,std::allocator<uint256>> *)local_738,
                                 (iterator)local_738._8_8_,(uint256 *)local_4c8);
                    }
                    local_4d8 = (undefined1  [16])0x0;
                    local_4e8 = (undefined1  [16])0x0;
                    local_58 = (undefined1  [16])0x0;
                    local_68 = (undefined1  [16])0x0;
                    local_78 = (undefined1  [16])0x0;
                    local_88 = (undefined1  [16])0x0;
                    local_98.pi_ = (sp_counted_base *)0x0;
                    puStack_90 = (undefined1 *)0x0;
                    local_a8[0] = (class_property<bool>)0x0;
                    local_a8._1_7_ = 0;
                    abStack_a0[0] = false;
                    abStack_a0[1] = false;
                    abStack_a0[2] = false;
                    abStack_a0[3] = false;
                    abStack_a0[4] = false;
                    abStack_a0[5] = false;
                    abStack_a0[6] = false;
                    abStack_a0[7] = false;
                    local_48 = 0;
                    CSHA256::CSHA256((CSHA256 *)local_a8);
                    CSHA256::Write((CSHA256 *)local_a8,(uchar *)puVar38,0x20);
                    CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                    output_02.m_size = 0x20;
                    output_02.m_data = local_4e8;
                    CHash256::Finalize((CHash256 *)local_a8,output_02);
                    local_4c8 = (undefined1  [8])local_4e8._0_8_;
                    asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                    asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                    auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                    bVar19 = (byte)uVar41;
                    puVar38 = puVar38 + 1;
                    lVar31 = lVar31 + -1;
                    uVar27 = uVar41 & 0x1f;
                    uVar41 = uVar41 + 1;
                  } while ((uVar25 >> uVar27 & 1) == 0);
                  uVar40 = uVar40 - (int)lVar31;
                }
                uVar41 = uVar40;
                uVar27 = 1 << (bVar19 & 0x1f);
              } while (uVar25 != uVar27);
              peVar37 = (element_type *)
                        CONCAT71(local_5d8._1_7_,
                                 local_5d8.p_predicate_value.super_readonly_property<bool>.
                                 super_class_property<bool>.value);
            }
          }
          if (peVar37 != (element_type *)0x0) {
            operator_delete(peVar37,(long)local_5d8.m_message.pn.pi_ - (long)peVar37);
          }
          local_4e8 = (undefined1  [16])0x0;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_4d8._8_8_;
          local_4d8 = auVar10 << 0x40;
          uVar39 = (ulong)(CONCAT53(local_508._11_5_,local_508._8_3_) - local_508._0_8_) >> 4;
          if (1 < (int)uVar39) {
            iVar14 = 0;
            uVar42 = uVar17 & 0xffffffff;
            do {
              uVar40 = (uint)uVar42 ^ 1;
              uVar41 = (uint)uVar39;
              if ((int)(uVar41 - 1) < (int)uVar40) {
                uVar40 = uVar41 - 1;
              }
              puVar38 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)(uVar40 + iVar14);
              if (local_4e8._8_8_ == local_4d8._0_8_) {
                std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                          ((vector<uint256,std::allocator<uint256>> *)local_4e8,
                           (iterator)local_4e8._8_8_,puVar38);
              }
              else {
                uVar60 = *(undefined8 *)(puVar38->super_base_blob<256U>).m_data._M_elems;
                uVar7 = *(undefined8 *)((puVar38->super_base_blob<256U>).m_data._M_elems + 8);
                uVar8 = *(undefined8 *)((puVar38->super_base_blob<256U>).m_data._M_elems + 0x18);
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 0x10) =
                     *(undefined8 *)((puVar38->super_base_blob<256U>).m_data._M_elems + 0x10);
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 0x18) =
                     uVar8;
                *(undefined8 *)(((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems = uVar60;
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 8) = uVar7
                ;
                local_4e8._8_8_ = (uint256 *)(local_4e8._8_8_ + 0x20);
              }
              uVar42 = (ulong)(uint)((int)(uint)uVar42 >> 1);
              iVar14 = iVar14 + uVar41;
              uVar39 = (ulong)(uVar41 + 1 >> 1);
            } while (2 < uVar41);
          }
          local_748 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_740 = "";
          local_758 = &boost::unit_test::basic_cstring<char_const>::null;
          local_750 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0xf4;
          file_05.m_begin = (iterator)&local_748;
          msg_05.m_end = in_R9;
          msg_05.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_758,msg_05);
          if (local_4e8._8_8_ - local_4e8._0_8_ == local_738._8_8_ - local_738._0_8_) {
            local_a8[0] = (class_property<bool>)true;
            pcVar33 = (char *)local_738._0_8_;
            for (pcVar23 = (char *)local_4e8._0_8_; pcVar23 != (char *)local_4e8._8_8_;
                pcVar23 = pcVar23 + 0x20) {
              auVar57[0] = -(*pcVar33 == *pcVar23);
              auVar57[1] = -(pcVar33[1] == pcVar23[1]);
              auVar57[2] = -(pcVar33[2] == pcVar23[2]);
              auVar57[3] = -(pcVar33[3] == pcVar23[3]);
              auVar57[4] = -(pcVar33[4] == pcVar23[4]);
              auVar57[5] = -(pcVar33[5] == pcVar23[5]);
              auVar57[6] = -(pcVar33[6] == pcVar23[6]);
              auVar57[7] = -(pcVar33[7] == pcVar23[7]);
              auVar57[8] = -(pcVar33[8] == pcVar23[8]);
              auVar57[9] = -(pcVar33[9] == pcVar23[9]);
              auVar57[10] = -(pcVar33[10] == pcVar23[10]);
              auVar57[0xb] = -(pcVar33[0xb] == pcVar23[0xb]);
              auVar57[0xc] = -(pcVar33[0xc] == pcVar23[0xc]);
              auVar57[0xd] = -(pcVar33[0xd] == pcVar23[0xd]);
              auVar57[0xe] = -(pcVar33[0xe] == pcVar23[0xe]);
              auVar57[0xf] = -(pcVar33[0xf] == pcVar23[0xf]);
              auVar49[0] = -(pcVar33[0x10] == pcVar23[0x10]);
              auVar49[1] = -(pcVar33[0x11] == pcVar23[0x11]);
              auVar49[2] = -(pcVar33[0x12] == pcVar23[0x12]);
              auVar49[3] = -(pcVar33[0x13] == pcVar23[0x13]);
              auVar49[4] = -(pcVar33[0x14] == pcVar23[0x14]);
              auVar49[5] = -(pcVar33[0x15] == pcVar23[0x15]);
              auVar49[6] = -(pcVar33[0x16] == pcVar23[0x16]);
              auVar49[7] = -(pcVar33[0x17] == pcVar23[0x17]);
              auVar49[8] = -(pcVar33[0x18] == pcVar23[0x18]);
              auVar49[9] = -(pcVar33[0x19] == pcVar23[0x19]);
              auVar49[10] = -(pcVar33[0x1a] == pcVar23[0x1a]);
              auVar49[0xb] = -(pcVar33[0x1b] == pcVar23[0x1b]);
              auVar49[0xc] = -(pcVar33[0x1c] == pcVar23[0x1c]);
              auVar49[0xd] = -(pcVar33[0x1d] == pcVar23[0x1d]);
              auVar49[0xe] = -(pcVar33[0x1e] == pcVar23[0x1e]);
              auVar49[0xf] = -(pcVar33[0x1f] == pcVar23[0x1f]);
              auVar49 = auVar49 & auVar57;
              if ((ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00435191;
              pcVar33 = pcVar33 + 0x20;
            }
          }
          else {
LAB_00435191:
            local_a8[0] = (class_property<bool>)false;
          }
          abStack_a0[0] = false;
          abStack_a0[1] = false;
          abStack_a0[2] = false;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          local_98.pi_ = (sp_counted_base *)0x0;
          local_4c8 = (undefined1  [8])0xea8ac3;
          auStack_4c0 = (undefined1  [8])0xea8ad9;
          local_4a8[8] = 0;
          local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
          auStack_490._0_8_ = local_4c8;
          local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          local_768 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_760 = "";
          pvVar35 = (iterator)0x1;
          pvVar36 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,
                     CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_768,0xf4);
          boost::detail::shared_count::~shared_count(&local_98);
          local_778 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_770 = "";
          local_788 = &boost::unit_test::basic_cstring<char_const>::null;
          local_780 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0xf5;
          file_06.m_begin = (iterator)&local_778;
          msg_06.m_end = pvVar36;
          msg_06.m_begin = pvVar35;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_788,msg_06);
          peVar6 = (((pointer)(local_508._0_8_ + (long)(int)local_7e0 * 0x10))->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4c8 = *(undefined1 (*) [8])
                       (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          _auStack_4c0 = *(undefined1 (*) [16])
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
          ;
          asStack_4b8[1].pi_ =
               *(sp_counted_base **)
                ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          puVar44 = (uchar *)local_738._0_8_;
          if (local_738._0_8_ != local_738._8_8_) {
            do {
              if ((uVar17 & 1) == 0) {
                local_98.pi_ = (sp_counted_base *)0x0;
                puStack_90 = (undefined1 *)0x0;
                local_a8[0] = (class_property<bool>)0x0;
                local_a8._1_7_ = 0;
                abStack_a0[0] = false;
                abStack_a0[1] = false;
                abStack_a0[2] = false;
                abStack_a0[3] = false;
                abStack_a0[4] = false;
                abStack_a0[5] = false;
                abStack_a0[6] = false;
                abStack_a0[7] = false;
                local_458 = (undefined1  [16])0x0;
                local_468 = (undefined1  [16])0x0;
                local_478 = (undefined1  [16])0x0;
                auStack_490._8_16_ = (undefined1  [16])0x0;
                local_498 = (undefined1  [8])0x0;
                auStack_490._0_8_ = (pointer)0x0;
                local_4a8._0_8_ = (_func_int **)0x0;
                local_4a8[8] = false;
                local_4a8._9_7_ = 0;
                local_448 = 0;
                CSHA256::CSHA256((CSHA256 *)local_4a8);
                CSHA256::Write((CSHA256 *)local_4a8,local_4c8,0x20);
                CSHA256::Write((CSHA256 *)local_4a8,puVar44,0x20);
                output_03.m_size = 0x20;
                output_03.m_data = local_a8;
                CHash256::Finalize((CHash256 *)local_4a8,output_03);
              }
              else {
                local_98.pi_ = (sp_counted_base *)0x0;
                puStack_90 = (undefined1 *)0x0;
                local_a8[0] = (class_property<bool>)0x0;
                local_a8._1_7_ = 0;
                abStack_a0[0] = false;
                abStack_a0[1] = false;
                abStack_a0[2] = false;
                abStack_a0[3] = false;
                abStack_a0[4] = false;
                abStack_a0[5] = false;
                abStack_a0[6] = false;
                abStack_a0[7] = false;
                local_458 = (undefined1  [16])0x0;
                local_468 = (undefined1  [16])0x0;
                local_478 = (undefined1  [16])0x0;
                auStack_490._8_16_ = (undefined1  [16])0x0;
                local_498 = (undefined1  [8])0x0;
                auStack_490._0_8_ = (pointer)0x0;
                local_4a8._0_8_ = (_func_int **)0x0;
                local_4a8[8] = false;
                local_4a8._9_7_ = 0;
                local_448 = 0;
                CSHA256::CSHA256((CSHA256 *)local_4a8);
                CSHA256::Write((CSHA256 *)local_4a8,puVar44,0x20);
                CSHA256::Write((CSHA256 *)local_4a8,local_4c8,0x20);
                output_04.m_size = 0x20;
                output_04.m_data = local_a8;
                CHash256::Finalize((CHash256 *)local_4a8,output_04);
              }
              local_4c8 = (undefined1  [8])CONCAT71(local_a8._1_7_,local_a8[0]);
              auStack_4c0[1] = abStack_a0[1];
              auStack_4c0[2] = abStack_a0[2];
              auStack_4c0[3] = abStack_a0[3];
              auStack_4c0[4] = abStack_a0[4];
              auStack_4c0[5] = abStack_a0[5];
              auStack_4c0[6] = abStack_a0[6];
              auStack_4c0[7] = abStack_a0[7];
              auStack_4c0[0] = abStack_a0[0];
              asStack_4b8[0].pi_ = local_98.pi_;
              asStack_4b8[1].pi_ = (sp_counted_base *)puStack_90;
              uVar17 = uVar17 >> 1 & 0x7fffffff;
              puVar44 = puVar44 + 0x20;
            } while (puVar44 != (uchar *)local_738._8_8_);
          }
          auVar54[0] = -(asStack_4b8[0].pi_._0_1_ == local_588[0]);
          auVar54[1] = -(asStack_4b8[0].pi_._1_1_ == local_588[1]);
          auVar54[2] = -(asStack_4b8[0].pi_._2_1_ == local_588[2]);
          auVar54[3] = -(asStack_4b8[0].pi_._3_1_ == local_588[3]);
          auVar54[4] = -(asStack_4b8[0].pi_._4_1_ == local_588[4]);
          auVar54[5] = -(asStack_4b8[0].pi_._5_1_ == local_588[5]);
          auVar54[6] = -(asStack_4b8[0].pi_._6_1_ == local_588[6]);
          auVar54[7] = -(asStack_4b8[0].pi_._7_1_ == local_588[7]);
          auVar54[8] = -(asStack_4b8[1].pi_._0_1_ == local_588[8]);
          auVar54[9] = -(asStack_4b8[1].pi_._1_1_ == local_588[9]);
          auVar54[10] = -(asStack_4b8[1].pi_._2_1_ == local_588[10]);
          auVar54[0xb] = -(asStack_4b8[1].pi_._3_1_ == local_588[0xb]);
          auVar54[0xc] = -(asStack_4b8[1].pi_._4_1_ == local_588[0xc]);
          auVar54[0xd] = -(asStack_4b8[1].pi_._5_1_ == local_588[0xd]);
          auVar54[0xe] = -(asStack_4b8[1].pi_._6_1_ == local_588[0xe]);
          auVar54[0xf] = -(asStack_4b8[1].pi_._7_1_ == local_588[0xf]);
          auVar50[0] = -(local_4c8[0] == (readonly_property<bool>)local_598._0_1_);
          auVar50[1] = -(local_4c8[1] == local_598._1_1_);
          auVar50[2] = -(local_4c8[2] == local_598._2_1_);
          auVar50[3] = -(local_4c8[3] == local_598._3_1_);
          auVar50[4] = -(local_4c8[4] == local_598._4_1_);
          auVar50[5] = -(local_4c8[5] == local_598._5_1_);
          auVar50[6] = -(local_4c8[6] == local_598._6_1_);
          auVar50[7] = -(local_4c8[7] == local_598._7_1_);
          auVar50[8] = -(auStack_4c0[0] == (uchar)uStack_590);
          auVar50[9] = -(auStack_4c0[1] == uStack_590._1_1_);
          auVar50[10] = -(auStack_4c0[2] == uStack_590._2_1_);
          auVar50[0xb] = -(auStack_4c0[3] == uStack_590._3_1_);
          auVar50[0xc] = -(auStack_4c0[4] == uStack_590._4_1_);
          auVar50[0xd] = -(auStack_4c0[5] == uStack_590._5_1_);
          auVar50[0xe] = -(auStack_4c0[6] == uStack_590._6_1_);
          auVar50[0xf] = -(auStack_4c0[7] == uStack_590._7_1_);
          auVar50 = auVar50 & auVar54;
          local_5d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar50[0xf] >> 7) << 0xf) == 0xffff);
          local_5d8.m_message.px = (element_type *)0x0;
          local_5d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_a8[0] = (class_property<bool>)0xda;
          local_a8._1_7_ = 0xea8a;
          abStack_a0[0] = true;
          abStack_a0[1] = true;
          abStack_a0[2] = true;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          local_4a8[8] = 0;
          local_4a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
          auStack_490._0_8_ = local_a8;
          local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          local_798 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_790 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_5d8,(lazy_ostream *)local_4a8,1,0,WARN,
                     CONCAT17(cVar58,in_stack_fffffffffffff800),(size_t)&local_798,0xf5);
          boost::detail::shared_count::~shared_count(&local_5d8.m_message.pn);
          if ((void *)local_4e8._0_8_ != (void *)0x0) {
            operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ - local_4e8._0_8_);
          }
          if ((void *)local_738._0_8_ != (void *)0x0) {
            operator_delete((void *)local_738._0_8_,(long)local_728 - local_738._0_8_);
          }
          uVar41 = iVar13 + 1;
          uVar17 = (ulong)uVar41;
        } while (uVar41 != uVar32);
      }
      if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_628.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_628.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)local_508);
      iVar34 = iVar34 + 1;
    } while (iVar34 != 4);
    uVar28 = uVar28 + 1;
    __new_size = (ulong)uVar28;
    if (uVar28 == 0x20) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test)
{
    for (int i = 0; i < 32; i++) {
        // Try 32 block sizes: all sizes from 0 to 16 inclusive, and then 15 random sizes.
        int ntx = (i <= 16) ? i : 17 + (m_rng.randrange(4000));
        // Try up to 3 mutations.
        for (int mutate = 0; mutate <= 3; mutate++) {
            int duplicate1 = mutate >= 1 ? 1 << ctz(ntx) : 0; // The last how many transactions to duplicate first.
            if (duplicate1 >= ntx) break; // Duplication of the entire tree results in a different root (it adds a level).
            int ntx1 = ntx + duplicate1; // The resulting number of transactions after the first duplication.
            int duplicate2 = mutate >= 2 ? 1 << ctz(ntx1) : 0; // Likewise for the second mutation.
            if (duplicate2 >= ntx1) break;
            int ntx2 = ntx1 + duplicate2;
            int duplicate3 = mutate >= 3 ? 1 << ctz(ntx2) : 0; // And for the third mutation.
            if (duplicate3 >= ntx2) break;
            int ntx3 = ntx2 + duplicate3;
            // Build a block with ntx different transactions.
            CBlock block;
            block.vtx.resize(ntx);
            for (int j = 0; j < ntx; j++) {
                CMutableTransaction mtx;
                mtx.nLockTime = j;
                block.vtx[j] = MakeTransactionRef(std::move(mtx));
            }
            // Compute the root of the block before mutating it.
            bool unmutatedMutated = false;
            uint256 unmutatedRoot = BlockMerkleRoot(block, &unmutatedMutated);
            BOOST_CHECK(unmutatedMutated == false);
            // Optionally mutate by duplicating the last transactions, resulting in the same merkle root.
            block.vtx.resize(ntx3);
            for (int j = 0; j < duplicate1; j++) {
                block.vtx[ntx + j] = block.vtx[ntx + j - duplicate1];
            }
            for (int j = 0; j < duplicate2; j++) {
                block.vtx[ntx1 + j] = block.vtx[ntx1 + j - duplicate2];
            }
            for (int j = 0; j < duplicate3; j++) {
                block.vtx[ntx2 + j] = block.vtx[ntx2 + j - duplicate3];
            }
            // Compute the merkle root and merkle tree using the old mechanism.
            bool oldMutated = false;
            std::vector<uint256> merkleTree;
            uint256 oldRoot = BlockBuildMerkleTree(block, &oldMutated, merkleTree);
            // Compute the merkle root using the new mechanism.
            bool newMutated = false;
            uint256 newRoot = BlockMerkleRoot(block, &newMutated);
            BOOST_CHECK(oldRoot == newRoot);
            BOOST_CHECK(newRoot == unmutatedRoot);
            BOOST_CHECK((newRoot == uint256()) == (ntx == 0));
            BOOST_CHECK(oldMutated == newMutated);
            BOOST_CHECK(newMutated == !!mutate);
            // If no mutation was done (once for every ntx value), try up to 16 branches.
            if (mutate == 0) {
                for (int loop = 0; loop < std::min(ntx, 16); loop++) {
                    // If ntx <= 16, try all branches. Otherwise, try 16 random ones.
                    int mtx = loop;
                    if (ntx > 16) {
                        mtx = m_rng.randrange(ntx);
                    }
                    std::vector<uint256> newBranch = BlockMerkleBranch(block, mtx);
                    std::vector<uint256> oldBranch = BlockGetMerkleBranch(block, merkleTree, mtx);
                    BOOST_CHECK(oldBranch == newBranch);
                    BOOST_CHECK(ComputeMerkleRootFromBranch(block.vtx[mtx]->GetHash(), newBranch, mtx) == oldRoot);
                }
            }
        }
    }
}